

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

wchar_t archive_read_format_cab_cleanup(archive_read *a)

{
  void *__ptr;
  int local_24;
  wchar_t i;
  cfheader *hd;
  cab *cab;
  archive_read *a_local;
  
  __ptr = a->format->data;
  if (*(long *)((long)__ptr + 0x60) != 0) {
    for (local_24 = 0; local_24 < (int)(uint)*(ushort *)((long)__ptr + 0x50);
        local_24 = local_24 + 1) {
      free(*(void **)(*(long *)((long)__ptr + 0x60) + (long)local_24 * 0x60 + 0x38));
    }
    free(*(void **)((long)__ptr + 0x60));
  }
  if (*(long *)((long)__ptr + 0x68) != 0) {
    for (local_24 = 0; local_24 < (int)(uint)*(ushort *)((long)__ptr + 0x52);
        local_24 = local_24 + 1) {
      archive_string_free((archive_string *)
                          (*(long *)((long)__ptr + 0x68) + (long)local_24 * 0x30 + 0x18));
    }
    free(*(void **)((long)__ptr + 0x68));
  }
  if (*(char *)((long)__ptr + 0x180) != '\0') {
    cm_zlib_inflateEnd((z_streamp_conflict)((long)__ptr + 0x110));
  }
  lzx_decode_free((lzx_stream *)((long)__ptr + 0x188));
  archive_wstring_free((archive_wstring *)((long)__ptr + 0x78));
  free(*(void **)((long)__ptr + 0xa0));
  free(__ptr);
  a->format->data = (void *)0x0;
  return L'\0';
}

Assistant:

static int
archive_read_format_cab_cleanup(struct archive_read *a)
{
	struct cab *cab = (struct cab *)(a->format->data);
	struct cfheader *hd = &cab->cfheader;
	int i;

	if (hd->folder_array != NULL) {
		for (i = 0; i < hd->folder_count; i++)
			free(hd->folder_array[i].cfdata.memimage);
		free(hd->folder_array);
	}
	if (hd->file_array != NULL) {
		for (i = 0; i < cab->cfheader.file_count; i++)
			archive_string_free(&(hd->file_array[i].pathname));
		free(hd->file_array);
	}
#ifdef HAVE_ZLIB_H
	if (cab->stream_valid)
		inflateEnd(&cab->stream);
#endif
	lzx_decode_free(&cab->xstrm);
	archive_wstring_free(&cab->ws);
	free(cab->uncompressed_buffer);
	free(cab);
	(a->format->data) = NULL;
	return (ARCHIVE_OK);
}